

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

binarydata * __thiscall
network_pimpl::encode(binarydata *__return_storage_ptr__,network_pimpl *this)

{
  int tacq;
  int tsrc;
  
  _tacq = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(this->trodes_source,this->trodes_acquisition);
  NetworkDataType::
  serializedata<std::__cxx11::string_const,std::__cxx11::string_const,int_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const,std::vector<EventDataType,std::allocator<EventDataType>>const,std::vector<HighFreqDataType,std::allocator<HighFreqDataType>>const,int,int,std::__cxx11::string_const,std::__cxx11::string_const,std::__cxx11::string_const,int_const,std::__cxx11::string_const>
            (__return_storage_ptr__,(NetworkDataType *)&this->endpoint,&this->address,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->port,
             (int *)&this->clients,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&this->events,(vector<EventDataType,_std::allocator<EventDataType>_> *)&this->hfdts,
             (vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *)&tsrc,&tacq,
             (int *)&this->trodes_filename,&this->hardware_endpoint,&this->hardware_address,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->hardware_port,(int *)&this->timestamp_endpoint,_tacq);
  return __return_storage_ptr__;
}

Assistant:

binarydata network_pimpl::encode() const{
    int tsrc = (int)trodes_source;
    int tacq = (int)trodes_acquisition;
    return NetworkDataType::serializedata(endpoint, address, port, clients, events, hfdts,
                                          tsrc, tacq, trodes_filename,
                                          hardware_endpoint, hardware_address, hardware_port,
                                          timestamp_endpoint);
}